

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextstream.cpp
# Opt level: O2

PaddingResult __thiscall QTextStreamPrivate::padding(QTextStreamPrivate *this,qsizetype len)

{
  FieldAlignment FVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  PaddingResult PVar5;
  
  FVar1 = (this->params).fieldAlignment;
  if (FVar1 < 4) {
    lVar3 = (this->params).fieldWidth - len;
    switch(FVar1) {
    case AlignLeft:
      lVar4 = lVar3;
      goto LAB_00119e04;
    default:
      lVar4 = 0;
      lVar2 = lVar3;
      break;
    case AlignCenter:
      lVar2 = lVar3 / 2;
      lVar4 = lVar3 - lVar2;
    }
  }
  else {
    lVar4 = 0;
LAB_00119e04:
    lVar2 = 0;
  }
  PVar5.right = lVar4;
  PVar5.left = lVar2;
  return PVar5;
}

Assistant:

QTextStreamPrivate::PaddingResult QTextStreamPrivate::padding(qsizetype len) const
{
    Q_ASSERT(params.fieldWidth > len); // calling padding() when no padding is needed is an error

    qsizetype left = 0, right = 0;

    const qsizetype padSize = params.fieldWidth - len;

    switch (params.fieldAlignment) {
    case QTextStream::AlignLeft:
        right = padSize;
        break;
    case QTextStream::AlignRight:
    case QTextStream::AlignAccountingStyle:
        left  = padSize;
        break;
    case QTextStream::AlignCenter:
        left  = padSize/2;
        right = padSize - padSize/2;
        break;
    }
    return { left, right };
}